

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall google::protobuf::io::ArrayOutputStream::BackUp(ArrayOutputStream *this,int count)

{
  int iVar1;
  Nonnull<const_char_*> failure_msg;
  LogMessage LStack_18;
  
  iVar1 = this->last_returned_size_;
  if (iVar1 < count) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)count,(long)iVar1,"count <= last_returned_size_");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x76,failure_msg);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_18,(char (*) [58])"BackUp() can not exceed the size of the last Next() call."
              );
  }
  else {
    if (-1 < count) {
      this->position_ = this->position_ - count;
      this->last_returned_size_ = iVar1 - count;
      return;
    }
    BackUp();
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

void ArrayOutputStream::BackUp(int count) {
  ABSL_CHECK_LE(count, last_returned_size_)
      << "BackUp() can not exceed the size of the last Next() call.";
  ABSL_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ -= count;
}